

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::OpenPopupEx(ImGuiID id)

{
  int *piVar1;
  ImVec2 IVar2;
  int iVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  ImGuiPopupData *pIVar7;
  ulong uVar8;
  ulong uVar9;
  ImGuiContext *pIVar10;
  ImGuiPopupData *pIVar11;
  int iVar12;
  ImVec2 *pIVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  ImVec2 local_38;
  undefined1 extraout_var [56];
  
  pIVar10 = GImGui;
  iVar12 = (GImGui->BeginPopupStack).Size;
  pIVar5 = GImGui->NavWindow;
  iVar3 = GImGui->FrameCount;
  uVar4 = (GImGui->CurrentWindow->IDStack).Data[(long)(GImGui->CurrentWindow->IDStack).Size + -1];
  auVar17._0_8_ = NavCalcPreferredRefPos();
  auVar17._8_56_ = extraout_var;
  auVar16 = auVar17._0_16_;
  local_38 = (ImVec2)vmovlps_avx(auVar16);
  uVar8 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)(pIVar10->IO).MousePos.x),2);
  uVar9 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)(pIVar10->IO).MousePos.y),2);
  pIVar13 = &(pIVar10->IO).MousePos;
  if ((uVar8 & uVar9 & 1) == 0) {
    pIVar13 = &local_38;
  }
  iVar14 = (pIVar10->OpenPopupStack).Size;
  IVar6 = *pIVar13;
  if (iVar12 < iVar14) {
    pIVar11 = (pIVar10->OpenPopupStack).Data;
    if ((pIVar11[iVar12].PopupId == id) && (pIVar11[iVar12].OpenFrameCount == iVar3 + -1)) {
      pIVar11[iVar12].OpenFrameCount = iVar3;
      return;
    }
    iVar14 = (pIVar10->OpenPopupStack).Capacity;
    iVar15 = iVar12 + 1;
    if (iVar14 <= iVar12) {
      if (iVar14 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar14 / 2 + iVar14;
      }
      if (iVar14 <= iVar15) {
        iVar14 = iVar15;
      }
      piVar1 = &(pIVar10->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      pIVar11 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)((long)iVar14 * 0x30,GImAllocatorUserData)
      ;
      pIVar7 = (pIVar10->OpenPopupStack).Data;
      if (pIVar7 != (ImGuiPopupData *)0x0) {
        memcpy(pIVar11,pIVar7,(long)(pIVar10->OpenPopupStack).Size * 0x30);
        pIVar7 = (pIVar10->OpenPopupStack).Data;
        if ((pIVar7 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
      }
      (pIVar10->OpenPopupStack).Data = pIVar11;
      (pIVar10->OpenPopupStack).Capacity = iVar14;
    }
    (pIVar10->OpenPopupStack).Size = iVar15;
    pIVar11[iVar12].PopupId = id;
    pIVar11[iVar12].Window = (ImGuiWindow *)0x0;
    pIVar11[iVar12].SourceWindow = pIVar5;
    pIVar11[iVar12].OpenFrameCount = iVar3;
    pIVar11[iVar12].OpenParentId = uVar4;
    IVar2 = (ImVec2)vmovlps_avx(auVar16);
    pIVar11[iVar12].OpenPopupPos = IVar2;
    pIVar11[iVar12].OpenMousePos = IVar6;
  }
  else {
    if (iVar14 == (pIVar10->OpenPopupStack).Capacity) {
      if (iVar14 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar14 / 2 + iVar14;
      }
      iVar15 = iVar14 + 1;
      if (iVar14 + 1 < iVar12) {
        iVar15 = iVar12;
      }
      piVar1 = &(pIVar10->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      pIVar11 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)((long)iVar15 * 0x30,GImAllocatorUserData)
      ;
      pIVar7 = (pIVar10->OpenPopupStack).Data;
      if (pIVar7 != (ImGuiPopupData *)0x0) {
        memcpy(pIVar11,pIVar7,(long)(pIVar10->OpenPopupStack).Size * 0x30);
        pIVar7 = (pIVar10->OpenPopupStack).Data;
        if ((pIVar7 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
      }
      (pIVar10->OpenPopupStack).Data = pIVar11;
      (pIVar10->OpenPopupStack).Capacity = iVar15;
      iVar14 = (pIVar10->OpenPopupStack).Size;
    }
    else {
      pIVar11 = (pIVar10->OpenPopupStack).Data;
    }
    pIVar11[iVar14].PopupId = id;
    pIVar11[iVar14].Window = (ImGuiWindow *)0x0;
    pIVar11[iVar14].SourceWindow = pIVar5;
    pIVar11[iVar14].OpenFrameCount = iVar3;
    pIVar11[iVar14].OpenParentId = uVar4;
    IVar2 = (ImVec2)vmovlps_avx(auVar16);
    pIVar11[iVar14].OpenPopupPos = IVar2;
    pIVar11[iVar14].OpenMousePos = IVar6;
    (pIVar10->OpenPopupStack).Size = (pIVar10->OpenPopupStack).Size + 1;
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}